

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator.cpp
# Opt level: O0

void __thiscall
dominator::dfs(dominator *this,BasicBlock *bb,
              set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_> *visited,
              int *id)

{
  int iVar1;
  bool bVar2;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *this_00;
  reference ppBVar3;
  mapped_type *pmVar4;
  _Self local_68;
  _Self local_60;
  BasicBlock *local_58;
  BasicBlock *_bb;
  iterator __end1;
  iterator __begin1;
  list<BasicBlock_*,_std::allocator<BasicBlock_*>_> *__range1;
  int *id_local;
  set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_> *visited_local;
  BasicBlock *bb_local;
  dominator *this_local;
  
  visited_local = (set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_> *)bb;
  bb_local = (BasicBlock *)this;
  std::set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_>::insert
            ((pair<std::_Rb_tree_const_iterator<BasicBlock_*>,_bool> *)visited,
             (set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_> *)
             &visited_local,(value_type *)visited);
  this_00 = BasicBlock::get_succ_basic_blocks_abi_cxx11_((BasicBlock *)visited_local);
  __end1 = std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::begin(this_00);
  _bb = (BasicBlock *)std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::end(this_00);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&_bb), bVar2) {
    ppBVar3 = std::_List_iterator<BasicBlock_*>::operator*(&__end1);
    local_58 = *ppBVar3;
    bVar2 = BasicBlock::is_fake_block(local_58);
    if (!bVar2) {
      local_60._M_node =
           (_Base_ptr)
           std::set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_>::find
                     (visited,&local_58);
      local_68._M_node =
           (_Base_ptr)
           std::set<BasicBlock_*,_std::less<BasicBlock_*>,_std::allocator<BasicBlock_*>_>::end
                     (visited);
      bVar2 = std::operator==(&local_60,&local_68);
      if (bVar2) {
        dfs(this,local_58,visited,id);
      }
    }
    std::_List_iterator<BasicBlock_*>::operator++(&__end1);
  }
  iVar1 = *id;
  *id = iVar1 + 1;
  pmVar4 = std::
           map<BasicBlock_*,_int,_std::less<BasicBlock_*>,_std::allocator<std::pair<BasicBlock_*const,_int>_>_>
           ::operator[](&this->_postOrderID,(key_type *)&visited_local);
  *pmVar4 = iVar1;
  std::__cxx11::list<BasicBlock_*,_std::allocator<BasicBlock_*>_>::push_back
            (&this->_reversedPostOrderQueue,(value_type *)&visited_local);
  return;
}

Assistant:

void dominator::dfs(BasicBlock *bb, std::set<BasicBlock *> &visited, int &id){
    visited.insert(bb);
    for (auto _bb : bb->get_succ_basic_blocks()) {
        // 跳过假块
        if(_bb->is_fake_block()) continue;
        // 若没有访问过则对其访问，否则跳过
        if (visited.find(_bb) == visited.end()) {
            dfs(_bb, visited, id);
        }
    }
    _postOrderID[bb] = id++;
    _reversedPostOrderQueue.push_back(bb);
}